

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O3

void DCT(Block *block)

{
  int iVar1;
  uint k;
  ulong uVar2;
  int *piVar3;
  uint i;
  long lVar4;
  uint k_1;
  int *piVar5;
  uint n;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  Block temp;
  int local_138 [66];
  
  piVar5 = local_138;
  memcpy(piVar5,block,0x100);
  lVar4 = 0;
  do {
    uVar2 = 0;
    do {
      dVar8 = 0.0;
      lVar6 = 0;
      do {
        iVar1 = piVar5[lVar6];
        dVar9 = cos(((double)(int)lVar6 + 0.5) * 3.141592653589793 * (double)(int)uVar2 * 0.125);
        dVar8 = dVar8 + dVar9 * (double)iVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      (*block)[uVar2 | lVar4 * 8] =
           (int)(dVar8 * *(double *)(&DAT_001062d0 + (ulong)(uVar2 == 0) * 8));
      uVar2 = uVar2 + 1;
    } while (uVar2 != 8);
    lVar4 = lVar4 + 1;
    piVar5 = piVar5 + 8;
  } while (lVar4 != 8);
  piVar5 = local_138;
  memcpy(piVar5,block,0x100);
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      dVar8 = 0.0;
      lVar7 = 0;
      piVar3 = piVar5;
      do {
        iVar1 = *piVar3;
        dVar9 = cos(((double)(int)lVar7 + 0.5) * 3.141592653589793 * (double)(int)lVar6 * 0.125);
        dVar8 = dVar8 + dVar9 * (double)iVar1;
        lVar7 = lVar7 + 1;
        piVar3 = piVar3 + 8;
      } while (lVar7 != 8);
      (*block)[lVar4 + lVar6 * 8] =
           (int)(dVar8 * *(double *)(&DAT_001062d0 + (ulong)(lVar6 == 0) * 8));
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    lVar4 = lVar4 + 1;
    piVar5 = piVar5 + 1;
  } while (lVar4 != 8);
  return;
}

Assistant:

void DCT(Block& block) {
    Block temp;
    std::memcpy(&temp, &block, sizeof(Block)); //copy from original
    //8 rows
    //DCT行变化
    for(uint i = 0; i < 8; i++) {
        int* f = &temp[i * 8]; //one dimension Array , and will perform DCT on it
        for(uint k = 0; k < 8; k++) {
            double sum = 0.0;
            for(uint n = 0; n < 8; n++){
                sum = sum + f[n] * std::cos(((n + 0.5) * M_PI * k / 8));
            }
            sum = (k == 0) ? (sum * std::sqrt(1.0 / 8)) : (sum * std::sqrt(2.0 / 8));
            block[i * 8 + k] = sum;
        }
    }
    
    std::memcpy(&temp, &block, sizeof(Block)); //copy from 
    //DCT列变化
    for(uint i = 0; i < 8; i++) {
        int* f = &temp[i]; //one dimension Array with 8 steps increment , and will perform DCT on it
        for(uint k = 0; k < 8; k++) {
            double sum = 0.0;
            for(uint n = 0; n < 8; n++){
                sum = sum + f[n * 8] * std::cos(((n + 0.5) * M_PI * k / 8));
            }
            sum = (k == 0) ? (sum * std::sqrt(1.0 / 8)) : (sum * std::sqrt(2.0 / 8));
            block[i + k * 8] = sum;
        }
    }
}